

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O0

void test_ambiguous(void)

{
  nng_err num;
  char *pcVar1;
  char *pcVar2;
  undefined1 local_88 [4];
  nng_err result_;
  nng_arg_spec spec [3];
  char *local_38;
  char *a;
  int v;
  int ac;
  char *av [2];
  int local_c [2];
  int opti;
  
  local_c[0] = 1;
  a._4_4_ = 2;
  local_38 = (char *)0x0;
  memcpy(local_88,&DAT_0016b8c0,0x48);
  _v = "program";
  av[0] = "--fl";
  num = nng_args_parse(a._4_4_,(char **)&v,(nng_arg_spec *)local_88,(int *)&a,&local_38,local_c);
  pcVar1 = nng_strerror(~NNG_ENOMEM);
  acutest_check_((uint)(num == ~NNG_ENOMEM),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x116,"%s fails with %s","nng_args_parse(ac, av, spec, &v, &a, &opti)",pcVar1);
  pcVar1 = nng_strerror(~NNG_ENOMEM);
  pcVar2 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_args_parse(ac, av, spec, &v, &a, &opti)"
                   ,pcVar1,0xfffffffd,pcVar2,(ulong)num);
  return;
}

Assistant:

void
test_ambiguous(void)
{
	int   opti = 1;
	char *av[2];
	int   ac = 2;
	int   v;
	char *a = NULL;

	nng_arg_spec spec[] = {
		{ "flag", 'f', 1, false },
		{ "fluid", 0, 2, false },
		{ NULL, 0, 0, false },
	};

	av[0] = "program";
	av[1] = "--fl";
	NUTS_FAIL(nng_args_parse(ac, av, spec, &v, &a, &opti), NNG_ARG_AMBIG);
}